

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O3

void __thiscall
Js::JavascriptFunction::JavascriptFunction
          (JavascriptFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          ConstructorCache *cache)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DynamicTypeHandler *pDVar5;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_30;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014faf28;
  Memory::Recycler::WBSetBit((char *)&this->constructorCache);
  (this->constructorCache).ptr = cache;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->constructorCache);
  Memory::Recycler::WBSetBit((char *)&this->functionInfo);
  (this->functionInfo).ptr = functionInfo;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->functionInfo);
  if ((this->constructorCache).ptr == (ConstructorCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x39,"(this->constructorCache != nullptr)",
                                "this->constructorCache != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pDVar5 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  DynamicTypeHandler::SetHasOnlyWritableDataProperties(pDVar5,false);
  pDVar5 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  if ((pDVar5->flags & 0x20) != 0) {
    pJVar1 = (((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
    Memory::Recycler::WBSetBit((char *)&local_30);
    local_30 = &pJVar1->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_30);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_30);
  }
  return;
}

Assistant:

JavascriptFunction::JavascriptFunction(DynamicType * type, FunctionInfo * functionInfo, ConstructorCache* cache)
        : DynamicObject(type), functionInfo(functionInfo), constructorCache(cache)
    {
        Assert(this->constructorCache != nullptr);
        this->GetTypeHandler()->ClearHasOnlyWritableDataProperties(); // length is non-writable
        if (GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag)
        {
            // No need to invalidate store field caches for non-writable properties here. Since this type is just being created, it cannot represent
            // an object that is already a prototype. If it becomes a prototype and then we attempt to add a property to an object derived from this
            // object, then we will check if this property is writable, and only if it is will we do the fast path for add property.
            // GetScriptContext()->InvalidateStoreFieldCaches(PropertyIds::length);
            GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }
    }